

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall gl4cts::GPUShaderFP64Test7::initTest(GPUShaderFP64Test7 *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLint GVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  uchar *puVar6;
  int local_3c;
  int local_38;
  GLint gl_max_vertex_output_components_value;
  GLint gl_max_transform_feedback_interleaved_components_value;
  GLint gl_max_tess_evaluation_output_components_value;
  GLint gl_max_tess_evaluation_input_components_value;
  GLint gl_max_tess_control_output_components_value;
  GLint gl_max_tess_control_input_components_value;
  GLint gl_max_geometry_output_components_value;
  GLint gl_max_geometry_input_components_value;
  GLint gl_max_fragment_input_components_value;
  Functions *gl;
  GPUShaderFP64Test7 *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  _gl_max_geometry_input_components_value = CONCAT44(extraout_var,iVar2);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_vertex_attrib_64bit");
  this->m_are_double_inputs_supported = bVar1;
  (**(code **)(_gl_max_geometry_input_components_value + 0x708))(1,&this->m_vao_id);
  dVar3 = (**(code **)(_gl_max_geometry_input_components_value + 0x800))();
  glu::checkError(dVar3,"glGenVertexArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2713);
  (**(code **)(_gl_max_geometry_input_components_value + 0xd8))(this->m_vao_id);
  dVar3 = (**(code **)(_gl_max_geometry_input_components_value + 0x800))();
  glu::checkError(dVar3,"glBindVertexArray() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2716);
  (**(code **)(_gl_max_geometry_input_components_value + 0x6f8))(1,&this->m_to_id);
  dVar3 = (**(code **)(_gl_max_geometry_input_components_value + 0x800))();
  glu::checkError(dVar3,"glGenTextures() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x271a);
  (**(code **)(_gl_max_geometry_input_components_value + 0xb8))(0xde1,this->m_to_id);
  dVar3 = (**(code **)(_gl_max_geometry_input_components_value + 0x800))();
  glu::checkError(dVar3,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x271d);
  (**(code **)(_gl_max_geometry_input_components_value + 0x1380))
            (0xde1,1,0x8058,this->m_to_width,this->m_to_height);
  dVar3 = (**(code **)(_gl_max_geometry_input_components_value + 0x800))();
  glu::checkError(dVar3,"glTexStorage2D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2720);
  puVar6 = (uchar *)operator_new__((ulong)(this->m_to_width * this->m_to_height * 4));
  this->m_to_data = puVar6;
  (**(code **)(_gl_max_geometry_input_components_value + 0x6d0))(1,&this->m_fbo_id);
  dVar3 = (**(code **)(_gl_max_geometry_input_components_value + 0x800))();
  glu::checkError(dVar3,"glGenFramebuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2728);
  (**(code **)(_gl_max_geometry_input_components_value + 0x78))(0x8d40,this->m_fbo_id);
  dVar3 = (**(code **)(_gl_max_geometry_input_components_value + 0x800))();
  glu::checkError(dVar3,"glBindframebuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x272b);
  (**(code **)(_gl_max_geometry_input_components_value + 0x6a0))
            (0x8ca9,0x8ce0,0xde1,this->m_to_id,0);
  dVar3 = (**(code **)(_gl_max_geometry_input_components_value + 0x800))();
  glu::checkError(dVar3,"glFramebufferTexture2D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x272e);
  GVar4 = (**(code **)(_gl_max_geometry_input_components_value + 0x3f0))(0x8b30);
  this->m_fs_id = GVar4;
  GVar4 = (**(code **)(_gl_max_geometry_input_components_value + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar4;
  GVar4 = (**(code **)(_gl_max_geometry_input_components_value + 0x3f0))(0x8e88);
  this->m_tc_id = GVar4;
  GVar4 = (**(code **)(_gl_max_geometry_input_components_value + 0x3f0))(0x8e87);
  this->m_te_id = GVar4;
  GVar4 = (**(code **)(_gl_max_geometry_input_components_value + 0x3f0))(0x8b31);
  this->m_vs_id = GVar4;
  dVar3 = (**(code **)(_gl_max_geometry_input_components_value + 0x800))();
  glu::checkError(dVar3,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2736);
  GVar4 = (**(code **)(_gl_max_geometry_input_components_value + 0x3c8))();
  this->m_po_id = GVar4;
  dVar3 = (**(code **)(_gl_max_geometry_input_components_value + 0x800))();
  glu::checkError(dVar3,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x273a);
  (**(code **)(_gl_max_geometry_input_components_value + 0x10))(this->m_po_id,this->m_fs_id);
  (**(code **)(_gl_max_geometry_input_components_value + 0x10))(this->m_po_id,this->m_gs_id);
  (**(code **)(_gl_max_geometry_input_components_value + 0x10))(this->m_po_id,this->m_tc_id);
  (**(code **)(_gl_max_geometry_input_components_value + 0x10))(this->m_po_id,this->m_te_id);
  (**(code **)(_gl_max_geometry_input_components_value + 0x10))(this->m_po_id,this->m_vs_id);
  dVar3 = (**(code **)(_gl_max_geometry_input_components_value + 0x800))();
  glu::checkError(dVar3,"glAttachShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2742);
  gl_max_geometry_output_components_value = 0;
  gl_max_tess_control_input_components_value = 0;
  gl_max_tess_control_output_components_value = 0;
  gl_max_tess_evaluation_input_components_value = 0;
  gl_max_tess_evaluation_output_components_value = 0;
  gl_max_transform_feedback_interleaved_components_value = 0;
  gl_max_vertex_output_components_value = 0;
  local_38 = 0;
  local_3c = 0;
  (**(code **)(_gl_max_geometry_input_components_value + 0x868))
            (0x9125,&gl_max_geometry_output_components_value);
  (**(code **)(_gl_max_geometry_input_components_value + 0x868))
            (0x9123,&gl_max_tess_control_input_components_value);
  (**(code **)(_gl_max_geometry_input_components_value + 0x868))
            (0x9124,&gl_max_tess_control_output_components_value);
  (**(code **)(_gl_max_geometry_input_components_value + 0x868))
            (0x886c,&gl_max_tess_evaluation_input_components_value);
  (**(code **)(_gl_max_geometry_input_components_value + 0x868))
            (0x8e83,&gl_max_tess_evaluation_output_components_value);
  (**(code **)(_gl_max_geometry_input_components_value + 0x868))
            (0x886d,&gl_max_transform_feedback_interleaved_components_value);
  (**(code **)(_gl_max_geometry_input_components_value + 0x868))
            (0x8e86,&gl_max_vertex_output_components_value);
  (**(code **)(_gl_max_geometry_input_components_value + 0x868))(0x8c8a,&local_38);
  (**(code **)(_gl_max_geometry_input_components_value + 0x868))(0x9122,&local_3c);
  dVar3 = (**(code **)(_gl_max_geometry_input_components_value + 0x800))();
  glu::checkError(dVar3,"glGetintegerv() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x275f);
  iVar2 = de::min<int>(local_3c,gl_max_tess_evaluation_input_components_value);
  this->m_n_max_components_per_stage = iVar2;
  iVar2 = de::min<int>(this->m_n_max_components_per_stage,gl_max_geometry_output_components_value);
  this->m_n_max_components_per_stage = iVar2;
  iVar2 = de::min<int>(this->m_n_max_components_per_stage,gl_max_tess_control_input_components_value
                      );
  this->m_n_max_components_per_stage = iVar2;
  iVar2 = de::min<int>(this->m_n_max_components_per_stage,
                       gl_max_tess_control_output_components_value);
  this->m_n_max_components_per_stage = iVar2;
  iVar2 = de::min<int>(this->m_n_max_components_per_stage,
                       gl_max_tess_evaluation_output_components_value);
  this->m_n_max_components_per_stage = iVar2;
  iVar2 = de::min<int>(this->m_n_max_components_per_stage,
                       gl_max_transform_feedback_interleaved_components_value);
  this->m_n_max_components_per_stage = iVar2;
  iVar2 = de::min<int>(this->m_n_max_components_per_stage,gl_max_vertex_output_components_value);
  this->m_n_max_components_per_stage = iVar2;
  iVar2 = de::min<int>(this->m_n_max_components_per_stage,local_38);
  this->m_n_max_components_per_stage = iVar2;
  (**(code **)(_gl_max_geometry_input_components_value + 0xfd8))(0x8e72,1);
  dVar3 = (**(code **)(_gl_max_geometry_input_components_value + 0x800))();
  glu::checkError(dVar3,"glPatchParameteri() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2771);
  (**(code **)(_gl_max_geometry_input_components_value + 0x6c8))(1,&this->m_xfb_bo_id);
  dVar3 = (**(code **)(_gl_max_geometry_input_components_value + 0x800))();
  glu::checkError(dVar3,"glGenBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2775);
  (**(code **)(_gl_max_geometry_input_components_value + 0x40))(0x8c8e,this->m_xfb_bo_id);
  dVar3 = (**(code **)(_gl_max_geometry_input_components_value + 0x800))();
  glu::checkError(dVar3,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2778);
  (**(code **)(_gl_max_geometry_input_components_value + 0x48))(0x8c8e,0,this->m_xfb_bo_id);
  dVar3 = (**(code **)(_gl_max_geometry_input_components_value + 0x800))();
  glu::checkError(dVar3,"glBindBufferBase() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x277b);
  return;
}

Assistant:

void GPUShaderFP64Test7::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Are double-precision input variables supported? */
	m_are_double_inputs_supported = m_context.getContextInfo().isExtensionSupported("GL_ARB_vertex_attrib_64bit");

	/* Create a vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	/* Create a texture object we will use as FBO's color attachment */
	gl.genTextures(1, &m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed");

	gl.bindTexture(GL_TEXTURE_2D, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texStorage2D(GL_TEXTURE_2D, 1 /* levels */, GL_RGBA8, m_to_width, m_to_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

	/* Allocate temporary buffer to hold the texture data we will be reading
	 * from color attachment. */
	m_to_data = new unsigned char[m_to_width * m_to_height * 4 /* RGBA */];

	/* Create and set up a framebuffer object */
	gl.genFramebuffers(1, &m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call failed.");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindframebuffer() call failed.");

	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_to_id, 0 /* level */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

	/* Create all shader objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_tc_id = gl.createShader(GL_TESS_CONTROL_SHADER);
	m_te_id = gl.createShader(GL_TESS_EVALUATION_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Create test program object */
	m_po_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Attach the shaders to the program object */
	gl.attachShader(m_po_id, m_fs_id);
	gl.attachShader(m_po_id, m_gs_id);
	gl.attachShader(m_po_id, m_tc_id);
	gl.attachShader(m_po_id, m_te_id);
	gl.attachShader(m_po_id, m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

	/* The test passes double-precision values through the whole rendering pipeline.
	 * This translates to a notable amount of components that we would need to transfer
	 * all values in one fell swoop. The number is large enough to exceed minimum
	 * capabilities as described for OpenGL 4.0 implementations.
	 * For that reason, the test executes in turns. Each turn is allocated as many
	 * double-precision scalar/matrix values as supported by the tested GL implementation.
	 */
	glw::GLint gl_max_fragment_input_components_value				  = 0;
	glw::GLint gl_max_geometry_input_components_value				  = 0;
	glw::GLint gl_max_geometry_output_components_value				  = 0;
	glw::GLint gl_max_tess_control_input_components_value			  = 0;
	glw::GLint gl_max_tess_control_output_components_value			  = 0;
	glw::GLint gl_max_tess_evaluation_input_components_value		  = 0;
	glw::GLint gl_max_tess_evaluation_output_components_value		  = 0;
	glw::GLint gl_max_transform_feedback_interleaved_components_value = 0;
	glw::GLint gl_max_vertex_output_components_value				  = 0;

	gl.getIntegerv(GL_MAX_FRAGMENT_INPUT_COMPONENTS, &gl_max_fragment_input_components_value);
	gl.getIntegerv(GL_MAX_GEOMETRY_INPUT_COMPONENTS, &gl_max_geometry_input_components_value);
	gl.getIntegerv(GL_MAX_GEOMETRY_OUTPUT_COMPONENTS, &gl_max_geometry_output_components_value);
	gl.getIntegerv(GL_MAX_TESS_CONTROL_INPUT_COMPONENTS, &gl_max_tess_control_input_components_value);
	gl.getIntegerv(GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS, &gl_max_tess_control_output_components_value);
	gl.getIntegerv(GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS, &gl_max_tess_evaluation_input_components_value);
	gl.getIntegerv(GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS, &gl_max_tess_evaluation_output_components_value);
	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS,
				   &gl_max_transform_feedback_interleaved_components_value);
	gl.getIntegerv(GL_MAX_VERTEX_OUTPUT_COMPONENTS, &gl_max_vertex_output_components_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetintegerv() call(s) failed.");

	m_n_max_components_per_stage =
		de::min(gl_max_vertex_output_components_value, gl_max_tess_control_input_components_value);
	m_n_max_components_per_stage = de::min(m_n_max_components_per_stage, gl_max_fragment_input_components_value);
	m_n_max_components_per_stage = de::min(m_n_max_components_per_stage, gl_max_geometry_input_components_value);
	m_n_max_components_per_stage = de::min(m_n_max_components_per_stage, gl_max_geometry_output_components_value);
	m_n_max_components_per_stage = de::min(m_n_max_components_per_stage, gl_max_tess_control_output_components_value);
	m_n_max_components_per_stage = de::min(m_n_max_components_per_stage, gl_max_tess_evaluation_input_components_value);
	m_n_max_components_per_stage =
		de::min(m_n_max_components_per_stage, gl_max_tess_evaluation_output_components_value);
	m_n_max_components_per_stage =
		de::min(m_n_max_components_per_stage, gl_max_transform_feedback_interleaved_components_value);

	/* Update GL_PATCH_VERTICES setting so that we only use a single vertex to build
	 * the input patch */
	gl.patchParameteri(GL_PATCH_VERTICES, 1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteri() call failed.");

	/* Initialize a BO we will use to hold XFB data */
	gl.genBuffers(1, &m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed.");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_xfb_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");
}